

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::readValueFrom
          (TypedAttribute<Imath_3_2::Matrix33<float>_> *this,IStream *is,int size,int version)

{
  uchar b [4];
  float local_1c;
  
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).x[0][0] = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).x[0][1] = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).x[0][2] = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).x[1][0] = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).x[1][1] = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).x[1][2] = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).x[2][0] = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).x[2][1] = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).x[2][2] = local_1c;
  return;
}

Assistant:

IMF_EXPORT void
M33fAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value[0][0]);
    Xdr::read<StreamIO> (is, _value[0][1]);
    Xdr::read<StreamIO> (is, _value[0][2]);

    Xdr::read<StreamIO> (is, _value[1][0]);
    Xdr::read<StreamIO> (is, _value[1][1]);
    Xdr::read<StreamIO> (is, _value[1][2]);

    Xdr::read<StreamIO> (is, _value[2][0]);
    Xdr::read<StreamIO> (is, _value[2][1]);
    Xdr::read<StreamIO> (is, _value[2][2]);
}